

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
               (basic_string_view<char> fmt,format_handler<char> *handler)

{
  unkbyte10 Var1;
  char cVar2;
  bool bVar3;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  basic_string_view<char> value;
  basic_string_view<char> value_00;
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  undefined1 value_04 [16];
  handle h;
  handle h_00;
  custom_value<fmt::v11::context> custom;
  format_handler<char> *pfVar4;
  size_t sVar5;
  format_handler<char> *pfVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar7;
  format_handler<char> *pfVar8;
  char *in_RDX;
  char c;
  char *p;
  char *end;
  char *begin;
  char c_1;
  id_adapter adapter;
  int arg_id;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  undefined2 in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf2;
  format_handler<char> *in_stack_fffffffffffffcf8;
  float fVar9;
  format_handler<char> *in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd0a;
  format_handler<char> *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  context *in_stack_fffffffffffffd20;
  custom_value<fmt::v11::context> *in_stack_fffffffffffffd28;
  char local_2b9;
  default_arg_formatter<char> *in_stack_fffffffffffffd50;
  default_arg_formatter<char> *this;
  default_arg_formatter<char> *in_stack_fffffffffffffd58;
  default_arg_formatter<char> *in_stack_fffffffffffffd60;
  format_handler<char> *local_250;
  basic_string_view<char> local_230;
  char local_219;
  int local_210;
  int local_204;
  char *pcVar10;
  format_handler<char> *in_stack_fffffffffffffe18;
  format_handler<char> local_1e0;
  monostate local_199;
  void *local_198;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_190;
  handle local_188;
  basic_string_view<char> local_178;
  uint128_opt *local_168;
  uint128_opt *local_158;
  uint128_opt *local_148;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_140;
  int128_opt *local_138;
  int128_opt *local_128;
  int128_opt *local_118;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_110;
  format_handler<char> *local_100;
  custom_value<fmt::v11::context> *local_f8;
  default_arg_formatter<char> local_f0;
  uint128_opt *local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  undefined4 local_d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  int local_bc;
  monostate local_a9 [17];
  handle local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  int128_opt *local_48;
  int128_opt *local_38;
  default_arg_formatter<char> *local_10;
  uint128_opt **local_8;
  
  pfVar4 = (format_handler<char> *)basic_string_view<char>::data(&local_230);
  sVar5 = basic_string_view<char>::size(&local_230);
  pfVar6 = (format_handler<char> *)((long)&(pfVar4->parse_ctx).fmt_.data_ + sVar5);
LAB_00645d47:
  do {
    while( true ) {
      while( true ) {
        local_250 = pfVar4;
        if (local_250 == pfVar6) {
          format_handler<char>::on_text
                    (in_stack_fffffffffffffd10,
                     (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
          return;
        }
        pfVar4 = (format_handler<char> *)((long)&(local_250->parse_ctx).fmt_.data_ + 1);
        cVar2 = *(char *)&(local_250->parse_ctx).fmt_.data_;
        if (cVar2 == '{') break;
        if (cVar2 == '}') {
          if ((pfVar4 == pfVar6) || (*(char *)&(pfVar4->parse_ctx).fmt_.data_ != '}')) {
            format_handler<char>::on_error
                      ((format_handler<char> *)
                       CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                       (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          }
          format_handler<char>::on_text
                    (in_stack_fffffffffffffd10,
                     (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                     (char *)in_stack_fffffffffffffd00);
          pfVar4 = (format_handler<char> *)((long)&(local_250->parse_ctx).fmt_.data_ + 2);
        }
      }
      format_handler<char>::on_text
                (in_stack_fffffffffffffd10,
                 (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                 (char *)in_stack_fffffffffffffd00);
      aVar7.values_ = (value<fmt::v11::context> *)((long)&(local_250->parse_ctx).fmt_.data_ + 1);
      if ((format_handler<char> *)aVar7.values_ == pfVar6) {
        format_handler<char>::on_error
                  ((format_handler<char> *)
                   CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      local_204 = 0;
      bVar3 = ((aVar7.values_)->field_0).bool_value;
      pcVar10 = in_RDX;
      pfVar4 = pfVar6;
      if (bVar3 != true) break;
      local_204 = format_handler<char>::on_arg_id((format_handler<char> *)0x6462f0);
LAB_0064679b:
      pfVar8 = (format_handler<char> *)
               format_handler<char>::on_format_specs
                         (in_stack_fffffffffffffe18,aVar7._4_4_,(char *)pfVar4,pcVar10);
      if ((pfVar8 == pfVar4) || (*(char *)&(pfVar8->parse_ctx).fmt_.data_ != '}')) {
        format_handler<char>::on_error
                  ((format_handler<char> *)
                   CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      in_stack_fffffffffffffe18 =
           (format_handler<char> *)((long)&(pfVar8->parse_ctx).fmt_.data_ + 1);
      pfVar4 = in_stack_fffffffffffffe18;
    }
    if (bVar3 != true) {
      if (bVar3 == true) {
        local_bc = format_handler<char>::on_arg_id((format_handler<char> *)0x645e7e);
        local_c8 = aVar7;
        v11::context::arg((context *)CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                          in_stack_fffffffffffffcec);
        local_f0.out.container = v11::context::out((context *)(in_RDX + 0x18));
        this = &local_f0;
        fVar9 = (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        local_10 = this;
        local_8 = &local_e8;
        switch(local_d8) {
        case 0:
        default:
          monostate::monostate(local_a9);
          default_arg_formatter<char>::operator()(this);
          break;
        case 1:
          default_arg_formatter<char>::operator()<int,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(int)fVar9);
          break;
        case 2:
          default_arg_formatter<char>::operator()<unsigned_int,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(uint)fVar9);
          break;
        case 3:
          default_arg_formatter<char>::operator()<long_long,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (longlong)in_stack_fffffffffffffcf8);
          break;
        case 4:
          default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (unsigned_long_long)in_stack_fffffffffffffcf8);
          break;
        case 5:
          x._4_4_ = in_stack_fffffffffffffcec;
          x._0_4_ = in_stack_fffffffffffffce8;
          x._8_2_ = in_stack_fffffffffffffcf0;
          x._10_6_ = in_stack_fffffffffffffcf2;
          local_48 = map((int128_opt *)local_e8,(int128_opt)x);
          value_01._8_7_ = in_stack_fffffffffffffd18;
          value_01._0_8_ = in_stack_fffffffffffffd10;
          value_01[0xf] = in_stack_fffffffffffffd1f;
          local_38 = local_48;
          default_arg_formatter<char>::operator()<__int128,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,(__int128)value_01);
          break;
        case 6:
          x_00._4_4_ = in_stack_fffffffffffffcec;
          x_00._0_4_ = in_stack_fffffffffffffce8;
          x_00._8_2_ = in_stack_fffffffffffffcf0;
          x_00._10_6_ = in_stack_fffffffffffffcf2;
          local_78 = map(local_e8,(uint128_opt)x_00);
          value_02._8_7_ = in_stack_fffffffffffffd18;
          value_02._0_8_ = in_stack_fffffffffffffd10;
          value_02[0xf] = in_stack_fffffffffffffd1f;
          local_68 = local_78;
          default_arg_formatter<char>::operator()<unsigned___int128,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,
                     (unsigned___int128)value_02);
          in_stack_fffffffffffffd60 = this;
          break;
        case 7:
          default_arg_formatter<char>::operator()<bool,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                     (bool)in_stack_fffffffffffffd1f);
          break;
        case 8:
          default_arg_formatter<char>::operator()<char,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (char)((ulong)in_stack_fffffffffffffcf8 >> 0x38));
          break;
        case 9:
          default_arg_formatter<char>::operator()<float,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,fVar9);
          break;
        case 10:
          default_arg_formatter<char>::operator()<double,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (double)in_stack_fffffffffffffcf8);
          break;
        case 0xb:
          in_stack_fffffffffffffce8 = SUB84(local_e8,0);
          in_stack_fffffffffffffcec = (int)((ulong)local_e8 >> 0x20);
          in_stack_fffffffffffffcf0 = uStack_e0;
          default_arg_formatter<char>::operator()<long_double,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd10,
                     (longdouble)CONCAT28(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00));
          break;
        case 0xc:
          default_arg_formatter<char>::operator()<const_char_*,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (char *)in_stack_fffffffffffffcf8);
          break;
        case 0xd:
          local_88 = string_value<char>::str((string_value<char> *)0x6461bb);
          value.data_._2_6_ = in_stack_fffffffffffffd0a;
          value.data_._0_2_ = in_stack_fffffffffffffd08;
          value.size_ = (size_t)in_stack_fffffffffffffd10;
          default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,value);
          in_stack_fffffffffffffd58 = this;
          break;
        case 0xe:
          default_arg_formatter<char>::operator()<const_void_*,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                     (void *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          break;
        case 0xf:
          custom.format._0_2_ = uStack_e0;
          custom.value = local_e8;
          custom.format._2_6_ = uStack_de;
          basic_format_arg<fmt::v11::context>::handle::handle(&local_98,custom);
          h.custom_.format =
               (_func_void_void_ptr_parse_context<char>_ptr_context_ptr *)in_stack_fffffffffffffd60;
          h.custom_.value = in_stack_fffffffffffffd58;
          default_arg_formatter<char>::operator()(this,h);
          in_stack_fffffffffffffd50 = this;
        }
        in_stack_fffffffffffffe18 =
             (format_handler<char> *)
             ((long)&(((parse_context<char> *)&(aVar7.args_)->value_)->fmt_).data_ + 1);
        pfVar4 = in_stack_fffffffffffffe18;
      }
      else {
        local_210 = 0;
        aVar7.values_ =
             (value<fmt::v11::context> *)
             parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                       ((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                        (id_adapter *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18))
        ;
        local_204 = local_210;
        if ((format_handler<char> *)aVar7.values_ == pfVar4) {
          local_2b9 = '\0';
        }
        else {
          local_2b9 = ((aVar7.values_)->field_0).bool_value;
        }
        local_219 = local_2b9;
        if (local_2b9 != '}') {
          if (local_2b9 != ':') {
            format_handler<char>::on_error
                      ((format_handler<char> *)
                       CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                       (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          }
          goto LAB_0064679b;
        }
        local_1e0.ctx.loc_.locale_._4_4_ = local_210;
        in_stack_fffffffffffffd20 = (context *)(pcVar10 + 0x18);
        in_stack_fffffffffffffd28 =
             (custom_value<fmt::v11::context> *)&local_1e0.parse_ctx.fmt_.size_;
        local_1e0.ctx.args_.field_1.values_ = aVar7.values_;
        v11::context::arg((context *)CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                          in_stack_fffffffffffffcec);
        local_1e0.parse_ctx.fmt_.data_ = (char *)v11::context::out(in_stack_fffffffffffffd20);
        pfVar4 = &local_1e0;
        fVar9 = (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        local_100 = pfVar4;
        local_f8 = in_stack_fffffffffffffd28;
        switch(*(undefined4 *)&in_stack_fffffffffffffd28[1].value) {
        case 0:
        default:
          monostate::monostate(&local_199);
          default_arg_formatter<char>::operator()((default_arg_formatter<char> *)pfVar4);
          in_stack_fffffffffffffcf8 = pfVar4;
          break;
        case 1:
          default_arg_formatter<char>::operator()<int,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(int)fVar9);
          break;
        case 2:
          default_arg_formatter<char>::operator()<unsigned_int,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(uint)fVar9);
          break;
        case 3:
          default_arg_formatter<char>::operator()<long_long,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (longlong)in_stack_fffffffffffffcf8);
          break;
        case 4:
          default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (unsigned_long_long)in_stack_fffffffffffffcf8);
          break;
        case 5:
          in_stack_fffffffffffffd18 = SUB87(pfVar4,0);
          in_stack_fffffffffffffd1f = (undefined1)((ulong)pfVar4 >> 0x38);
          local_118 = (int128_opt *)in_stack_fffffffffffffd28->value;
          local_110 = in_stack_fffffffffffffd28->format;
          x_01._4_4_ = in_stack_fffffffffffffcec;
          x_01._0_4_ = in_stack_fffffffffffffce8;
          x_01._8_2_ = in_stack_fffffffffffffcf0;
          x_01._10_6_ = in_stack_fffffffffffffcf2;
          local_138 = map(local_118,(int128_opt)x_01);
          value_03._8_7_ = in_stack_fffffffffffffd18;
          value_03._0_8_ = in_stack_fffffffffffffd10;
          value_03[0xf] = in_stack_fffffffffffffd1f;
          local_128 = local_138;
          default_arg_formatter<char>::operator()<__int128,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,(__int128)value_03);
          break;
        case 6:
          local_148 = (uint128_opt *)in_stack_fffffffffffffd28->value;
          local_140 = in_stack_fffffffffffffd28->format;
          x_02._4_4_ = in_stack_fffffffffffffcec;
          x_02._0_4_ = in_stack_fffffffffffffce8;
          x_02._8_2_ = in_stack_fffffffffffffcf0;
          x_02._10_6_ = in_stack_fffffffffffffcf2;
          local_168 = map(local_148,(uint128_opt)x_02);
          value_04._8_7_ = in_stack_fffffffffffffd18;
          value_04._0_8_ = pfVar4;
          value_04[0xf] = in_stack_fffffffffffffd1f;
          local_158 = local_168;
          default_arg_formatter<char>::operator()<unsigned___int128,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,
                     (unsigned___int128)value_04);
          in_stack_fffffffffffffd10 = pfVar4;
          break;
        case 7:
          default_arg_formatter<char>::operator()<bool,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                     (bool)in_stack_fffffffffffffd1f);
          break;
        case 8:
          default_arg_formatter<char>::operator()<char,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (char)((ulong)in_stack_fffffffffffffcf8 >> 0x38));
          break;
        case 9:
          default_arg_formatter<char>::operator()<float,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,fVar9);
          break;
        case 10:
          default_arg_formatter<char>::operator()<double,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (double)in_stack_fffffffffffffcf8);
          break;
        case 0xb:
          Var1 = *(unkbyte10 *)in_stack_fffffffffffffd28;
          in_stack_fffffffffffffce8 = (undefined4)Var1;
          in_stack_fffffffffffffcec = (int)((unkuint10)Var1 >> 0x20);
          in_stack_fffffffffffffcf0 = (undefined2)((unkuint10)Var1 >> 0x40);
          default_arg_formatter<char>::operator()<long_double,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd10,
                     (longdouble)CONCAT28(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00));
          break;
        case 0xc:
          default_arg_formatter<char>::operator()<const_char_*,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                     (char *)in_stack_fffffffffffffcf8);
          break;
        case 0xd:
          in_stack_fffffffffffffd08 = SUB82(pfVar4,0);
          in_stack_fffffffffffffd0a = (undefined6)((ulong)pfVar4 >> 0x10);
          local_178 = string_value<char>::str((string_value<char> *)0x646690);
          value_00.data_._2_6_ = in_stack_fffffffffffffd0a;
          value_00.data_._0_2_ = in_stack_fffffffffffffd08;
          value_00.size_ = (size_t)in_stack_fffffffffffffd10;
          default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,value_00);
          break;
        case 0xe:
          default_arg_formatter<char>::operator()<const_void_*,_0>
                    ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                     (void *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          break;
        case 0xf:
          local_198 = in_stack_fffffffffffffd28->value;
          local_190 = in_stack_fffffffffffffd28->format;
          basic_format_arg<fmt::v11::context>::handle::handle(&local_188,*in_stack_fffffffffffffd28)
          ;
          h_00.custom_.format =
               (_func_void_void_ptr_parse_context<char>_ptr_context_ptr *)in_stack_fffffffffffffd60;
          h_00.custom_.value = in_stack_fffffffffffffd58;
          default_arg_formatter<char>::operator()(in_stack_fffffffffffffd50,h_00);
          in_stack_fffffffffffffd00 = pfVar4;
        }
        in_stack_fffffffffffffe18 =
             (format_handler<char> *)
             ((long)&(((parse_context<char> *)&(aVar7.args_)->value_)->fmt_).data_ + 1);
        pfVar4 = in_stack_fffffffffffffe18;
      }
      goto LAB_00645d47;
    }
    format_handler<char>::on_text
              (in_stack_fffffffffffffd10,
               (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
               (char *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffe18 =
         (format_handler<char> *)
         ((long)&(((parse_context<char> *)&(aVar7.args_)->value_)->fmt_).data_ + 1);
    pfVar4 = in_stack_fffffffffffffe18;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}